

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
::operator()(optimize_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  local_context *ctx;
  double dVar1;
  double dVar2;
  double __y;
  FILE *theta;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  context *ctx_00;
  context *ctx_01;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  default_cost_type<double> *args_1;
  int iVar15;
  long loop;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar19 [16];
  double dVar18;
  undefined1 auVar20 [16];
  undefined1 extraout_var [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  default_cost_type<double> norm_costs;
  bit_array x;
  double ret;
  compute_order compute;
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  slv;
  double local_178;
  cost_type local_130;
  double local_120;
  double local_118;
  long local_110;
  bit_array_impl local_108;
  double local_f8;
  compute_order local_f0;
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  local_b8;
  undefined1 extraout_var_00 [56];
  
  args_1 = original_costs;
  bit_array_impl::bit_array_impl(&local_108,variables);
  ctx_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&local_130,ctx_00,original_costs,&ctx->rng,variables);
  dVar1 = (ctx_00->parameters).kappa_step;
  dVar2 = (ctx_00->parameters).kappa_max;
  __y = (ctx_00->parameters).alpha;
  theta = (FILE *)(ctx_00->parameters).theta;
  local_178 = (ctx_00->parameters).delta;
  if (local_178 < 0.0) {
    ctx_01 = this->m_ctx;
    local_b8.super_debug_logger<false>.ofs = theta;
    info<>(ctx_01,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar16 = ZEXT816(0x7fefffffffffffff);
    }
    else {
      uVar12 = 0;
      auVar23._8_8_ = 0x7fffffffffffffff;
      auVar23._0_8_ = 0x7fffffffffffffff;
      auVar3 = ZEXT816(0x7fefffffffffffff);
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             *(double *)
              ((long)local_130.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar12 * 8);
        auVar16 = vandpd_avx(auVar26,auVar23);
        uVar6 = vcmppd_avx512vl(auVar16,auVar3,1);
        uVar7 = vcmppd_avx512vl(auVar26,ZEXT816(0) << 0x40,4);
        bVar8 = (byte)uVar7 & 3 & (byte)uVar6 & 3;
        auVar16._0_8_ =
             (ulong)(bVar8 & 1) * auVar16._0_8_ + (ulong)!(bool)(bVar8 & 1) * auVar3._0_8_;
        auVar16._8_8_ = auVar3._8_8_;
        uVar12 = uVar12 + 1;
        auVar3 = auVar16;
      } while ((uint)variables != uVar12);
    }
    local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar16._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_b8.super_debug_logger<false>.ofs;
    auVar16 = vfnmadd132sd_fma(auVar16,auVar16,auVar3);
    local_f8 = auVar16._0_8_;
    info<double,double,double>
              ((baryonyx *)ctx_01,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n"
               ,(char *)&local_f8,(double *)&local_f0,(double *)&local_b8,(double *)args_1);
    local_178 = local_f8;
  }
  local_118 = (ctx_00->parameters).pushing_k_factor;
  local_120 = (ctx_00->parameters).pushing_objective_amplifier;
  local_110 = (long)(ctx_00->parameters).w;
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  ::solver_equalities_101coeff
            (&local_b8,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_130,constraints);
  compute_order::compute_order(&local_f0,(ctx_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    bVar14 = false;
    do {
      this->m_call_number = this->m_call_number + 1;
      dVar17 = best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
               ::reinit(best_recorder,ctx,bVar14,(ctx_00->parameters).kappa_min,
                        (ctx_00->parameters).kappa_max,(bit_array *)&local_108);
      compute_order::
      init<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
                (&local_f0,&local_b8,(bit_array *)&local_108);
      iVar13 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        loop = 0;
        auVar21 = ZEXT864((ulong)dVar17);
        bVar14 = false;
        while (loop != (ctx_00->parameters).limit) {
          auVar19._0_8_ = auVar21._0_8_;
          iVar15 = compute_order::
                   run<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,double>
                             (&local_f0,&local_b8,(bit_array *)&local_108,&ctx->rng,auVar19._0_8_,
                              local_178,(double)theta);
          if (iVar15 == 0) {
            dVar18 = default_cost_type<double>::results
                               (original_costs,(bit_array *)&local_108,cost_constant);
            best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_108,dVar18,loop);
            bVar14 = true;
            iVar13 = 0;
            bVar9 = false;
            auVar19._8_8_ = 0;
          }
          else {
            if (iVar15 <= iVar13) {
              iVar13 = iVar15;
            }
            if (local_110 < loop) {
              auVar21._0_8_ = pow((double)iVar15 / (double)local_b8.m,__y);
              auVar21._8_56_ = extraout_var;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = auVar19._0_8_;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = dVar1;
              auVar19 = vfmadd231sd_fma(auVar24,auVar21._0_16_,auVar4);
            }
            else {
              auVar19._8_8_ = 0;
            }
            bVar9 = auVar19._0_8_ <= dVar2;
          }
          auVar21 = ZEXT1664(auVar19);
          if ((!bVar9) || (loop = loop + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
        }
      }
      else {
        bVar14 = false;
      }
      if (iVar13 < 1) {
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar13 = 0;
          iVar15 = 0;
          do {
            if ((ctx_00->parameters).pushes_limit <= iVar15) break;
            iVar10 = compute_order::
                     push_and_run<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,double>
                               (&local_f0,&local_b8,(bit_array *)&local_108,&ctx->rng,local_118,
                                local_178,(double)theta,local_120);
            if (iVar10 == 0) {
              dVar18 = default_cost_type<double>::results
                                 (original_costs,(bit_array *)&local_108,cost_constant);
              best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_108,dVar18,
                           (long)~((ctx_00->parameters).pushing_iteration_limit * iVar15));
              bVar14 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              iVar10 = 1;
              auVar21 = ZEXT864((ulong)dVar17);
              while (iVar10 + -1 < (ctx_00->parameters).pushing_iteration_limit) {
                auVar20._0_8_ = auVar21._0_8_;
                iVar11 = compute_order::
                         run<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,double>
                                   (&local_f0,&local_b8,(bit_array *)&local_108,&ctx->rng,
                                    auVar20._0_8_,local_178,(double)theta);
                if (iVar11 == 0) {
                  dVar18 = default_cost_type<double>::results
                                     (original_costs,(bit_array *)&local_108,cost_constant);
                  best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_108,dVar18,
                               (long)((ctx_00->parameters).pushing_iteration_limit * iVar13 - iVar10
                                     ));
                  bVar14 = true;
                  break;
                }
                if ((double)(iVar10 + -1) <= (ctx_00->parameters).w) {
                  auVar20._8_8_ = 0;
                }
                else {
                  auVar22._0_8_ = pow((double)iVar11 / (double)local_b8.m,__y);
                  auVar22._8_56_ = extraout_var_00;
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = auVar20._0_8_;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = dVar1;
                  auVar20 = vfmadd231sd_fma(auVar25,auVar22._0_16_,auVar5);
                }
                auVar21 = ZEXT1664(auVar20);
                if ((dVar2 < auVar20._0_8_) ||
                   (iVar10 = iVar10 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
              }
            }
            iVar15 = iVar15 + 1;
            iVar13 = iVar13 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
        best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_108,iVar13,(ctx_00->parameters).limit);
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_f0.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  ::~solver_equalities_101coeff(&local_b8);
  if ((_Head_base<0UL,_double_*,_false>)
      local_130.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_130.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if (local_108.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_108.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }